

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Performance::anon_unknown_1::ModifyAfterWithMapBufferFlushCase::testWithBufferSize
          (ModifyAfterWithMapBufferFlushCase *this,
          UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
          *result,int bufferSize)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  deUint64 dVar4;
  void *dst;
  deUint64 dVar5;
  TestError *this_00;
  undefined8 *puVar6;
  long lVar7;
  uint numBytes;
  string local_50;
  long lVar3;
  
  iVar2 = (*((this->
             super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
             ).
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
             .super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  iVar2 = bufferSize + 3;
  if (-1 < bufferSize) {
    iVar2 = bufferSize;
  }
  lVar7 = 0;
  if (this->m_partialUpload != false) {
    lVar7 = (long)(int)((iVar2 >> 2) + 0xfU & 0xfffffff0);
    bufferSize = bufferSize / 2;
  }
  numBytes = bufferSize + 0xfU & 0xfffffff0;
  dVar4 = deGetMicroseconds();
  dst = (void *)(**(code **)(lVar3 + 0xd00))(0x8892,lVar7,(long)(int)numBytes,this->m_mapFlags);
  dVar5 = deGetMicroseconds();
  if (dst != (void *)0x0) {
    (result->duration).mapDuration = dVar5 - dVar4;
    dVar4 = medianTimeMemcpy(dst,(this->
                                 super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
                                 ).m_zeroData.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,numBytes);
    (result->duration).writeDuration = dVar4;
    dVar4 = deGetMicroseconds();
    (**(code **)(lVar3 + 0x658))(0x8892,0,(long)(int)numBytes);
    dVar5 = deGetMicroseconds();
    (result->duration).flushDuration = dVar5 - dVar4;
    dVar4 = deGetMicroseconds();
    cVar1 = (**(code **)(lVar3 + 0x1670))(0x8892);
    dVar5 = deGetMicroseconds();
    if (cVar1 == '\x01') {
      (result->duration).unmapDuration = dVar5 - dVar4;
      dVar4 = (dVar5 - dVar4) + (result->duration).mapDuration + (result->duration).writeDuration +
              (result->duration).flushDuration;
      (result->duration).totalDuration = dVar4;
      (result->duration).fitResponseDuration = dVar4;
      result->writtenSize = numBytes;
      return;
    }
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = &PTR__exception_0215a088;
    __cxa_throw(puVar6,&Performance::(anonymous_namespace)::UnmapFailureError::typeinfo,
                std::exception::~exception);
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"mapBufferRange returned null","");
  tcu::TestError::TestError(this_00,&local_50);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ModifyAfterWithMapBufferFlushCase::testWithBufferSize (UploadSampleResult<MapBufferRangeFlushDurationNoAlloc>& result, int bufferSize)
{
	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();
	const int					subdataOffset		= deAlign32((m_partialUpload) ? (bufferSize / 4) : (0), 4*4);
	const int					subdataSize			= deAlign32((m_partialUpload) ? (bufferSize / 2) : (bufferSize), 4*4);
	void*						mapPtr;

	// map
	{
		deUint64 startTime;
		deUint64 endTime;

		startTime = deGetMicroseconds();
		mapPtr = gl.mapBufferRange(GL_ARRAY_BUFFER, subdataOffset, subdataSize, m_mapFlags);
		endTime = deGetMicroseconds();

		if (!mapPtr)
			throw tcu::TestError("mapBufferRange returned null");

		result.duration.mapDuration = endTime - startTime;
	}

	// write
	{
		result.duration.writeDuration = medianTimeMemcpy(mapPtr, &m_zeroData[0], subdataSize);
	}

	// flush
	{
		deUint64 startTime;
		deUint64 endTime;

		startTime = deGetMicroseconds();
		gl.flushMappedBufferRange(GL_ARRAY_BUFFER, 0, subdataSize);
		endTime = deGetMicroseconds();

		result.duration.flushDuration = endTime - startTime;
	}

	// unmap
	{
		deUint64		startTime;
		deUint64		endTime;
		glw::GLboolean	unmapSucceeded;

		startTime = deGetMicroseconds();
		unmapSucceeded = gl.unmapBuffer(GL_ARRAY_BUFFER);
		endTime = deGetMicroseconds();

		if (unmapSucceeded != GL_TRUE)
			throw UnmapFailureError();

		result.duration.unmapDuration = endTime - startTime;
	}

	result.duration.totalDuration = result.duration.mapDuration + result.duration.writeDuration + result.duration.unmapDuration + result.duration.flushDuration;
	result.duration.fitResponseDuration = result.duration.totalDuration;
	result.writtenSize = subdataSize;
}